

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O0

int Am_Vertical_Layout_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  int local_1c8;
  int local_1c4;
  int local_194;
  int local_18c;
  int height;
  int width;
  Am_Object item;
  int local_80;
  int rank;
  int line_width;
  int line_rank;
  int indent;
  Am_Alignment v_align;
  Am_Alignment h_align;
  int v_spacing;
  int h_spacing;
  int top;
  int left;
  int top_offset;
  int local_50;
  int local_4c;
  int max_size;
  int max_rank;
  int local_40;
  int local_3c;
  int fixed_height;
  int fixed_width;
  Am_Object component;
  undefined1 local_20 [8];
  Am_Value_List components;
  Am_Object *self_local;
  
  components.item = (Am_List_Item *)self;
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x82,0);
  Am_Value_List::operator=((Am_Value_List *)local_20,pAVar5);
  Am_Object::Am_Object((Am_Object *)&fixed_height);
  Am_Value_List::Start((Am_Value_List *)local_20);
  while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_20), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar5 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::operator=((Am_Object *)&fixed_height,pAVar5);
    pAVar5 = Am_Object::Get((Am_Object *)&fixed_height,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    if (!bVar1) {
      Am_Value_List::Delete((Am_Value_List *)local_20,true);
    }
    Am_Value_List::Next((Am_Value_List *)local_20);
  }
  Am_Object::Am_Object((Am_Object *)&max_size,(Am_Object *)components.item);
  get_fixed_sizes((Am_Object *)&max_size,(Am_Value_List *)local_20,&local_3c,&local_40);
  Am_Object::~Am_Object((Am_Object *)&max_size);
  Am_Object::Am_Object((Am_Object *)&left,(Am_Object *)components.item);
  get_max_rank_and_size((Am_Object *)&left,&local_4c,&local_50);
  Am_Object::~Am_Object((Am_Object *)&left);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x9f,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x9e,0);
  h_spacing = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x95,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x96,0);
  v_align.value = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x97,0);
  Am_Alignment::Am_Alignment((Am_Alignment *)&indent,pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x98,0);
  Am_Alignment::Am_Alignment((Am_Alignment *)&line_rank,pAVar5);
  pAVar5 = Am_Object::Get((Am_Object *)components.item,0x9b,0);
  line_width = Am_Value::operator_cast_to_int(pAVar5);
  Am_Value_List::Start((Am_Value_List *)local_20);
  v_spacing = iVar2;
  do {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Am_Object::~Am_Object((Am_Object *)&fixed_height);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
      return 0;
    }
    find_line_size_and_rank
              ((Am_Value_List *)local_20,v_spacing,local_40,0x67,v_align.value,0x66,local_4c,
               local_50,&rank,&local_80);
    item.data._4_4_ = 0;
    while (item.data._4_4_ < rank) {
      Am_Object::Am_Object((Am_Object *)&height);
      pAVar5 = Am_Value_List::Get((Am_Value_List *)local_20);
      Am_Object::operator=((Am_Object *)&height,pAVar5);
      pAVar5 = Am_Object::Get((Am_Object *)&height,0x69,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
      if (bVar1) {
        pAVar5 = Am_Object::Get((Am_Object *)&height,0x66,0);
        iVar4 = Am_Value::operator_cast_to_int(pAVar5);
        pAVar5 = Am_Object::Get((Am_Object *)&height,0x67,0);
        local_1c4 = Am_Value::operator_cast_to_int(pAVar5);
        if (local_40 == 0) {
          Am_Object::Set((Am_Object *)&height,0x65,v_spacing,0);
        }
        else if (line_rank == 0) {
          Am_Object::Set((Am_Object *)&height,0x65,v_spacing + (local_40 - local_1c4) / 2,0);
        }
        else if (line_rank == 1) {
          Am_Object::Set((Am_Object *)&height,0x65,v_spacing,0);
        }
        else {
          if (line_rank != 2) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
            poVar6 = std::operator<<(poVar6,"Bad alignment value ");
            poVar6 = operator<<(poVar6,(Am_Alignment *)&line_rank);
            poVar6 = std::operator<<(poVar6," in Am_V_ALIGN of ");
            poVar6 = operator<<(poVar6,(Am_Object *)components.item);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            Am_Error();
          }
          Am_Object::Set((Am_Object *)&height,0x65,(v_spacing + local_40) - local_1c4,0);
        }
        if (indent == 0) {
          if (local_3c == 0) {
            local_194 = local_80;
          }
          else {
            local_194 = local_3c;
          }
          Am_Object::Set((Am_Object *)&height,100,h_spacing + (local_194 - iVar4) / 2,0);
        }
        else if (indent == 3) {
          Am_Object::Set((Am_Object *)&height,100,h_spacing,0);
        }
        else {
          if (indent != 4) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
            poVar6 = std::operator<<(poVar6,"Bad alignment value ");
            poVar6 = operator<<(poVar6,(Am_Alignment *)&indent);
            poVar6 = std::operator<<(poVar6," in Am_H_ALIGN of ");
            poVar6 = operator<<(poVar6,(Am_Object *)components.item);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            Am_Error();
          }
          if (local_3c == 0) {
            local_18c = local_80;
          }
          else {
            local_18c = local_3c;
          }
          Am_Object::Set((Am_Object *)&height,100,(h_spacing + local_18c) - iVar4,0);
        }
        if (local_40 != 0) {
          local_1c4 = local_40;
        }
        v_spacing = local_1c4 + v_align.value + v_spacing;
        item.data._4_4_ = item.data._4_4_ + 1;
      }
      Am_Value_List::Next((Am_Value_List *)local_20);
      Am_Object::~Am_Object((Am_Object *)&height);
    }
    if (local_3c == 0) {
      local_1c8 = local_80;
    }
    else {
      local_1c8 = local_3c;
    }
    h_spacing = local_1c8 + iVar3 + h_spacing;
    v_spacing = iVar2 + line_width;
  } while( true );
}

Assistant:

Am_Define_Formula(int, Am_Vertical_Layout)
{
  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  Am_Object component;
  for (components.Start(); !components.Last(); components.Next()) {
    component = components.Get();
    if (!(bool)component.Get(Am_VISIBLE))
      components.Delete();
  }
  int fixed_width, fixed_height;
  get_fixed_sizes(self, components, fixed_width, fixed_height);
  int max_rank, max_size;
  get_max_rank_and_size(self, max_rank, max_size);
  int top_offset = self.Get(Am_TOP_OFFSET);
  int left = self.Get(Am_LEFT_OFFSET);
  int top = top_offset;
  int h_spacing = self.Get(Am_H_SPACING);
  int v_spacing = self.Get(Am_V_SPACING);
  Am_Alignment h_align = self.Get(Am_H_ALIGN);
  Am_Alignment v_align = self.Get(Am_V_ALIGN);
  int indent = self.Get(Am_INDENT);
  components.Start();
  while (!components.Last()) {
    int line_rank;
    int line_width;
    find_line_size_and_rank(components, top, fixed_height, Am_HEIGHT, v_spacing,
                            Am_WIDTH, max_rank, max_size, line_rank,
                            line_width);
    int rank = 0;
    while (rank < line_rank) {
      Am_Object item;
      item = components.Get();
      if ((bool)item.Get(Am_VISIBLE)) {
        int width = item.Get(Am_WIDTH);
        int height = item.Get(Am_HEIGHT);
        if (fixed_height) {
          switch (v_align.value) {
          case Am_TOP_ALIGN_val:
            item.Set(Am_TOP, top);
            break;
          case Am_BOTTOM_ALIGN_val:
            item.Set(Am_TOP, top + fixed_height - height);
            break;
          case Am_CENTER_ALIGN_val:
            item.Set(Am_TOP, top + (fixed_height - height) / 2);
            break;
          default:
            Am_ERRORO("Bad alignment value " << v_align << " in Am_V_ALIGN of "
                                             << self,
                      self, Am_V_ALIGN);
          }
        } else
          item.Set(Am_TOP, top);
        switch (h_align.value) {
        case Am_LEFT_ALIGN_val:
          item.Set(Am_LEFT, left);
          break;
        case Am_RIGHT_ALIGN_val:
          item.Set(Am_LEFT,
                   left + (fixed_width ? fixed_width : line_width) - width);
          break;
        case Am_CENTER_ALIGN_val:
          item.Set(Am_LEFT,
                   left +
                       ((fixed_width ? fixed_width : line_width) - width) / 2);
          break;
        default:
          Am_ERRORO("Bad alignment value " << h_align << " in Am_H_ALIGN of "
                                           << self,
                    self, Am_H_ALIGN);
        }
        top += (fixed_height ? fixed_height : height) + v_spacing;
        ++rank;
      }
      components.Next();
    }
    left += (fixed_width ? fixed_width : line_width) + h_spacing;
    top = top_offset + indent;
  }
  return 0;
}